

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O0

Am_Object Am_Get_Animator(Am_Object *obj,Am_Slot_Key key)

{
  bool bVar1;
  uint uVar2;
  Am_Constraint *pAVar3;
  Am_Slot_Key in_DX;
  undefined6 in_register_00000032;
  Animation_Constraint *anim_constraint;
  Am_Constraint *curr;
  Am_Constraint_Iterator iter;
  Am_Slot slot;
  Am_Slot_Key key_local;
  Am_Object *obj_local;
  
  iter.current = (Am_Constraint_Iterator_Data *)
                 Am_Object_Advanced::Get_Slot
                           ((Am_Object_Advanced *)CONCAT62(in_register_00000032,key),in_DX);
  Am_Constraint_Iterator::Am_Constraint_Iterator
            ((Am_Constraint_Iterator *)&curr,(Am_Slot *)&iter.current);
  Am_Constraint_Iterator::Start((Am_Constraint_Iterator *)&curr);
  while( true ) {
    bVar1 = Am_Constraint_Iterator::Last((Am_Constraint_Iterator *)&curr);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      Am_Object::Am_Object(obj,&Am_No_Object);
      return (Am_Object)(Am_Object_Data *)obj;
    }
    pAVar3 = Am_Constraint_Iterator::Get((Am_Constraint_Iterator *)&curr);
    uVar2 = (**(pAVar3->super_Am_Registered_Type)._vptr_Am_Registered_Type)();
    if ((uVar2 & 0xffff) == (uint)Animation_Constraint::id) break;
    Am_Constraint_Iterator::Next((Am_Constraint_Iterator *)&curr);
  }
  Am_Object::Am_Object(obj,(Am_Object *)(pAVar3 + 5));
  return (Am_Object)(Am_Object_Data *)obj;
}

Assistant:

Am_Object
Am_Get_Animator(Am_Object obj, Am_Slot_Key key)
{
  Am_Slot slot = ((Am_Object_Advanced &)obj).Get_Slot(key);
  Am_Constraint_Iterator iter = slot;
  Am_Constraint *curr;
  for (iter.Start(); !iter.Last(); iter.Next()) {
    curr = iter.Get();
    if (curr->ID() == Animation_Constraint::id) {
      Animation_Constraint *anim_constraint = (Animation_Constraint *)curr;
      return anim_constraint->interpolator;
    }
  }

  return Am_No_Object;
}